

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O1

bool __thiscall
QCss::ValueExtractor::extractGeometry
          (ValueExtractor *this,int *w,int *h,int *minw,int *minh,int *maxw,int *maxh)

{
  Declaration *pDVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  int *piVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  int dummy;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->fontExtracted == 0) {
    local_3c = -0xff;
    extractFont(this,&this->f,&local_3c);
  }
  if ((this->declarations).d.size == 0) {
    bVar2 = false;
  }
  else {
    lVar4 = 0;
    uVar6 = 0;
    bVar2 = false;
    do {
      pDVar1 = (this->declarations).d.ptr;
      piVar5 = w;
      switch(*(undefined4 *)(*(long *)((long)&(pDVar1->d).d.ptr + lVar4) + 0x20)) {
      case 0x45:
        break;
      case 0x46:
        piVar5 = h;
        break;
      case 0x47:
        piVar5 = minw;
        break;
      case 0x48:
        piVar5 = minh;
        break;
      case 0x49:
        piVar5 = maxw;
        break;
      case 0x4a:
        piVar5 = maxh;
        break;
      default:
        goto switchD_005e5abb_default;
      }
      iVar3 = lengthValue(this,(Declaration *)((long)&(pDVar1->d).d.ptr + lVar4));
      *piVar5 = iVar3;
      bVar2 = true;
switchD_005e5abb_default:
      uVar6 = uVar6 + 1;
      lVar4 = lVar4 + 8;
    } while (uVar6 < (ulong)(this->declarations).d.size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool ValueExtractor::extractGeometry(int *w, int *h, int *minw, int *minh, int *maxw, int *maxh)
{
    extractFont();
    bool hit = false;
    for (int i = 0; i < declarations.size(); i++) {
        const Declaration &decl = declarations.at(i);
        switch (decl.d->propertyId) {
        case Width: *w = lengthValue(decl); break;
        case Height: *h = lengthValue(decl); break;
        case MinimumWidth: *minw = lengthValue(decl); break;
        case MinimumHeight: *minh = lengthValue(decl); break;
        case MaximumWidth: *maxw = lengthValue(decl); break;
        case MaximumHeight: *maxh = lengthValue(decl); break;
        default: continue;
        }
        hit = true;
    }

    return hit;
}